

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parsePathTerminals(Parser *this)

{
  bool bVar1;
  NameSyntax *pNVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  BumpAllocator *dst;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar3;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_b8;
  undefined1 local_a8;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> results;
  
  results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  while( true ) {
    pNVar2 = parseName(this,(bitmask<slang::parsing::detail::NameOptions>)0x40);
    local_b8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar2;
    local_a8 = 1;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (TokenOrSyntax *)&local_b8._M_first);
    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
    if (!bVar1) break;
    local_b8._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_a8 = 0;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (TokenOrSyntax *)&local_b8._M_first);
  }
  dst = (this->super_ParserBase).alloc;
  sVar3._M_ptr._0_4_ =
       SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                 (&results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)dst,
                  src);
  sVar3._M_ptr._4_4_ = extraout_var;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)dst);
  sVar3._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  return sVar3;
}

Assistant:

std::span<TokenOrSyntax> Parser::parsePathTerminals() {
    SmallVector<TokenOrSyntax, 4> results;
    while (true) {
        results.push_back(&parseName(NameOptions::NoClassScope));
        if (!peek(TokenKind::Comma))
            break;

        results.push_back(consume());
    }

    return results.copy(alloc);
}